

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lrq.cc
# Opt level: O3

void predict_or_learn<true>(LRQstate *lrq,single_learner *base,example *ec)

{
  _Rb_tree_header *p_Var1;
  features *this;
  float fVar2;
  byte bVar3;
  bool bVar4;
  byte *pbVar5;
  long lVar6;
  element_type *peVar7;
  features *pfVar8;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *this_00;
  uint uVar9;
  byte *pbVar10;
  _Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false> _Var11;
  ostream *poVar12;
  char *pcVar13;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ppVar14;
  _Base_ptr p_Var15;
  _Rb_tree_node_base *p_Var16;
  ulong uVar17;
  uint32_t *puVar18;
  undefined8 uVar19;
  ulong uVar20;
  uint uVar21;
  features *pfVar22;
  v_array<unsigned_char> *__range1;
  _Alloc_hider _Var23;
  float *pfVar24;
  float fVar25;
  uint64_t index;
  char *new_feature;
  char *new_space;
  stringstream new_feature_buffer;
  uint local_2b4;
  float local_2b0;
  float local_2ac;
  float local_2a8;
  float local_29c;
  shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_290;
  element_type local_280;
  example *local_240;
  ulong local_238;
  single_learner *local_230;
  ulong local_228;
  ulong local_220;
  ulong local_218;
  _Base_ptr local_210;
  features *local_208;
  features *local_200;
  ulong local_1f8;
  uint64_t *local_1f0;
  ulong local_1e8;
  long local_1e0;
  ulong local_1d8;
  long local_1d0;
  char *local_1c8;
  char *local_1c0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_1b8;
  float *local_1b0;
  undefined1 local_1a8 [376];
  
  local_280.second._M_string_length = (size_type)lrq->all;
  _Var23._M_p = (pointer)lrq->orig_size;
  local_230 = base;
  memset(_Var23._M_p,0,0x800);
  pbVar5 = (ec->super_example_predict).indices._end;
  for (pbVar10 = (ec->super_example_predict).indices._begin; pbVar10 != pbVar5;
      pbVar10 = (byte *)((long)pbVar10 + 1)) {
    bVar3 = *pbVar10;
    if (lrq->lrindices[bVar3] == true) {
      *(long *)((long)_Var23._M_p + (ulong)bVar3 * 8) =
           (long)(ec->super_example_predict).feature_space[bVar3].values._end -
           (long)(ec->super_example_predict).feature_space[bVar3].values._begin >> 2;
    }
  }
  fVar2 = (ec->l).simple.label;
  bVar4 = lrq->dropout;
  fVar25 = 1.0;
  local_29c = 1.0;
  if (bVar4 != false) {
    fVar25 = 0.5;
  }
  if ((fVar2 == 3.4028235e+38) && (!NAN(fVar2))) {
    local_29c = fVar25;
  }
  local_280.first.field_2._M_allocated_capacity = ec->example_counter;
  p_Var1 = &(lrq->lrpairs)._M_t._M_impl.super__Rb_tree_header;
  pfVar22 = (ec->super_example_predict).feature_space;
  local_1f0 = &lrq->seed;
  puVar18 = &(((parameters *)(local_280.second._M_string_length + 0x3590))->dense_weights).
             _stride_shift;
  if (((parameters *)(local_280.second._M_string_length + 0x3590))->sparse != false) {
    puVar18 = &(((parameters *)(local_280.second._M_string_length + 0x3590))->sparse_weights).
               _stride_shift;
  }
  local_1e8 = (ulong)*puVar18;
  uVar19 = CONCAT71((int7)(local_280.second._M_string_length >> 8),1);
  uVar17 = 0;
  local_2a8 = 0.0;
  local_2ac = 0.0;
  local_2b0 = 0.0;
  local_280.first.field_2._8_8_ = lrq;
  local_280.second._M_dataplus._M_p = _Var23._M_p;
  local_240 = ec;
  local_208 = pfVar22;
  do {
    local_280.second.field_2._M_allocated_capacity._0_4_ = (undefined4)uVar19;
    p_Var15 = (lrq->lrpairs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_228 = uVar17;
    if ((_Rb_tree_header *)p_Var15 != p_Var1) {
      local_218 = (ulong)((uint)local_280.first.field_2._M_allocated_capacity & 1);
      local_220 = local_218 ^ 1;
      do {
        lVar6 = *(long *)(p_Var15 + 1);
        uVar20 = (ulong)*(byte *)(lVar6 + local_218);
        bVar3 = *(byte *)(lVar6 + local_220);
        local_210 = p_Var15;
        uVar9 = atoi((char *)(lVar6 + 2));
        uVar17 = *(size_t *)((long)_Var23._M_p + uVar20 * 8);
        local_280.second.field_2._8_8_ = uVar20;
        if (uVar17 != 0) {
          local_238 = (ulong)bVar3;
          local_200 = pfVar22 + uVar20;
          this = pfVar22 + local_238;
          pfVar8 = pfVar22 + local_238;
          uVar20 = 0;
          do {
            if (uVar9 != 0) {
              local_1e0 = (ec->super_example_predict).ft_offset +
                          (local_200->indicies)._begin[uVar20];
              local_280.second.field_2._M_allocated_capacity._4_4_ =
                   (local_200->values)._begin[uVar20];
              local_2b4 = 1;
              local_1f8 = uVar20;
              do {
                if ((bVar4 != true || fVar2 == 3.4028235e+38) ||
                   (fVar25 = merand48(local_1f0), 0.5 < fVar25)) {
                  local_1d8 = (ulong)local_2b4;
                  local_1d0 = local_1d8 << ((byte)local_1e8 & 0x3f);
                  ppVar14 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)(local_1e0 + local_1d0);
                  lVar6 = *(long *)local_280.first.field_2._8_8_;
                  if (*(char *)(lVar6 + 0x3590) == '\x01') {
                    this_00 = (_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                               *)(lVar6 + 0x35b0);
                    local_290.
                    super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr = (element_type *)(*(ulong *)(lVar6 + 0x35e8) & (ulong)ppVar14);
                    _Var11._M_cur =
                         (__node_type *)
                         std::
                         _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                         ::find(this_00,(key_type_conflict *)&local_290);
                    if (_Var11._M_cur == (__node_type *)0x0) {
                      local_1b0 = calloc_or_throw<float>(1L << (*(byte *)(lVar6 + 0x35f0) & 0x3f));
                      local_1b8 = local_290.
                                  super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr;
                      std::
                      _Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      ::_M_emplace<std::pair<unsigned_long,float*>>
                                ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                                  *)this_00,&local_1b8);
                      _Var11._M_cur =
                           (__node_type *)
                           std::
                           _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                           ::find(this_00,(key_type_conflict *)&local_290);
                      if (*(code **)(lVar6 + 0x3608) != (code *)0x0) {
                        (**(code **)(lVar6 + 0x3608))
                                  (*(weight **)((long)_Var11._M_cur + 0x10),
                                   *(void **)(lVar6 + 0x35f8));
                      }
                    }
                    pfVar24 = *(float **)
                               ((long)&((_Var11._M_cur)->
                                       super__Hash_node_value<std::pair<const_unsigned_long,_float_*>,_false>
                                       ).
                                       super__Hash_node_value_base<std::pair<const_unsigned_long,_float_*>_>
                                       ._M_storage._M_storage + 8);
                  }
                  else {
                    pfVar24 = (float *)((*(ulong *)(lVar6 + 0x35a0) & (ulong)ppVar14) * 4 +
                                       *(long *)(lVar6 + 0x3598));
                  }
                  _Var23._M_p = local_280.second._M_dataplus._M_p;
                  fVar25 = (local_240->l).simple.label;
                  if ((((fVar25 != 3.4028235e+38) || (NAN(fVar25))) && (*pfVar24 == 0.0)) &&
                     (!NAN(*pfVar24))) {
                    local_1b8 = ppVar14;
                    fVar25 = merand48((uint64_t *)&local_1b8);
                    *pfVar24 = fVar25;
                  }
                  if (*(long *)(_Var23._M_p + local_238 * 8) != 0) {
                    uVar21 = 1;
                    uVar17 = 0;
                    do {
                      features::push_back(this,*pfVar24 * local_29c *
                                               (float)local_280.second.field_2._M_allocated_capacity
                                                      ._4_4_ * (this->values)._begin[uVar17],
                                          (this->indicies)._begin[uVar17] + local_1d0);
                      if ((*(bool *)(local_280.second._M_string_length + 0x3438) != false) ||
                         (*(bool *)(local_280.second._M_string_length + 0x3618) == true)) {
                        std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
                        local_290.
                        super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr._0_1_ = bVar3;
                        poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)local_1a8,(char *)&local_290,1);
                        local_290.
                        super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr._0_1_ = 0x5e;
                        poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                            (poVar12,(char *)&local_290,1);
                        peVar7 = (pfVar8->space_names)._begin[uVar17].
                                 super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr;
                        poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                            (poVar12,(peVar7->second)._M_dataplus._M_p,
                                             (peVar7->second)._M_string_length);
                        local_290.
                        super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr = (element_type *)
                                  CONCAT71(local_290.
                                           super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr._1_7_,0x5e);
                        poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                            (poVar12,(char *)&local_290,1);
                        std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
                        local_1c0 = strdup("lrq");
                        std::__cxx11::stringbuf::str();
                        peVar7 = local_290.
                                 super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr;
                        pcVar13 = strdup((char *)local_290.
                                                 super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                                                 ._M_ptr);
                        if (peVar7 != &local_280) {
                          operator_delete(peVar7);
                        }
                        local_1c8 = pcVar13;
                        ppVar14 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)operator_new(0x40);
                        std::
                        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::pair<char_*&,_char_*&,_true>(ppVar14,&local_1c0,&local_1c8);
                        local_290.
                        super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr = ppVar14;
                        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                        __shared_count<std::pair<std::__cxx11::string,std::__cxx11::string>*>
                                  (&local_290.
                                    super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount,ppVar14);
                        v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::push_back(&pfVar8->space_names,&local_290);
                        if (local_290.
                            super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi !=
                            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                    (local_290.
                                     super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount._M_pi);
                        }
                        std::__cxx11::stringstream::~stringstream((stringstream *)&local_1b8);
                        std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
                      }
                      uVar17 = (ulong)uVar21;
                      uVar21 = uVar21 + 1;
                    } while (uVar17 < *(ulong *)(local_280.second._M_dataplus._M_p + local_238 * 8))
                    ;
                  }
                }
                local_2b4 = local_2b4 + 1;
              } while (local_2b4 <= uVar9);
              uVar17 = *(ulong *)(local_280.second._M_dataplus._M_p +
                                 local_280.second.field_2._8_8_ * 8);
              uVar20 = local_1f8;
              pfVar22 = local_208;
              ec = local_240;
              _Var23._M_p = local_280.second._M_dataplus._M_p;
            }
            uVar20 = (ulong)((int)uVar20 + 1);
          } while (uVar20 < uVar17);
        }
        p_Var15 = (_Base_ptr)std::_Rb_tree_increment(local_210);
      } while ((_Rb_tree_header *)p_Var15 != p_Var1);
    }
    p_Var16 = (_Rb_tree_node_base *)
              (**(code **)(local_230 + 0x28))
                        (*(undefined8 *)(local_230 + 0x18),*(undefined8 *)(local_230 + 0x20),ec);
    lrq = (LRQstate *)local_280.first.field_2._8_8_;
    if ((local_280.second.field_2._M_allocated_capacity._0_4_ & 1) == 0) {
      (ec->pred).scalar = local_2a8;
      ec->loss = local_2ac;
      ec->confidence = local_2b0;
    }
    else {
      local_2a8 = (ec->pred).scalar;
      local_2ac = ec->loss;
      local_2b0 = ec->confidence;
    }
    if ((_Rb_tree_header *)*(_Base_ptr *)(local_280.first.field_2._8_8_ + 0x920) != p_Var1) {
      uVar9 = (uint)local_280.first.field_2._M_allocated_capacity;
      p_Var16 = *(_Base_ptr *)(local_280.first.field_2._8_8_ + 0x920);
      do {
        bVar3 = *(byte *)(*(long *)(p_Var16 + 1) + (ulong)(~uVar9 & 1));
        features::truncate_to(pfVar22 + bVar3,*(size_t *)((long)_Var23._M_p + (ulong)bVar3 * 8));
        p_Var16 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var16);
      } while ((_Rb_tree_header *)p_Var16 != p_Var1);
    }
    local_280.first.field_2._M_allocated_capacity =
         local_280.first.field_2._M_allocated_capacity + 1;
    uVar17 = CONCAT71((int7)((ulong)p_Var16 >> 8),1);
    uVar19 = 0;
  } while (fVar2 != 3.4028235e+38 && (local_228 & 1) == 0);
  return;
}

Assistant:

void predict_or_learn(LRQstate& lrq, single_learner& base, example& ec)
{
  vw& all = *lrq.all;

  // Remember original features

  memset(lrq.orig_size, 0, sizeof(lrq.orig_size));
  for (namespace_index i : ec.indices)
  {
    if (lrq.lrindices[i])
      lrq.orig_size[i] = ec.feature_space[i].size();
  }

  size_t which = ec.example_counter;
  float first_prediction = 0;
  float first_loss = 0;
  float first_uncertainty = 0;
  unsigned int maxiter = (is_learn && !example_is_test(ec)) ? 2 : 1;

  bool do_dropout = lrq.dropout && is_learn && !example_is_test(ec);
  float scale = (!lrq.dropout || do_dropout) ? 1.f : 0.5f;

  uint32_t stride_shift = lrq.all->weights.stride_shift();
  for (unsigned int iter = 0; iter < maxiter; ++iter, ++which)
  {
    // Add left LRQ features, holding right LRQ features fixed
    //     and vice versa
    // TODO: what happens with --lrq ab2 --lrq ac2
    //       i.e. namespace occurs multiple times (?)

    for (string const& i : lrq.lrpairs)
    {
      unsigned char left = i[which % 2];
      unsigned char right = i[(which + 1) % 2];
      unsigned int k = atoi(i.c_str() + 2);

      features& left_fs = ec.feature_space[left];
      for (unsigned int lfn = 0; lfn < lrq.orig_size[left]; ++lfn)
      {
        float lfx = left_fs.values[lfn];
        uint64_t lindex = left_fs.indicies[lfn] + ec.ft_offset;
        for (unsigned int n = 1; n <= k; ++n)
        {
          if (!do_dropout || cheesyrbit(lrq.seed))
          {
            uint64_t lwindex = (lindex + ((uint64_t)n << stride_shift));
            weight* lw = &lrq.all->weights[lwindex];

            // perturb away from saddle point at (0, 0)
            if (is_learn && !example_is_test(ec) && *lw == 0)
              *lw = cheesyrand(lwindex);  // not sure if lw needs a weight mask?

            features& right_fs = ec.feature_space[right];
            for (unsigned int rfn = 0; rfn < lrq.orig_size[right]; ++rfn)
            {
              // NB: ec.ft_offset added by base learner
              float rfx = right_fs.values[rfn];
              uint64_t rindex = right_fs.indicies[rfn];
              uint64_t rwindex = (rindex + ((uint64_t)n << stride_shift));

              right_fs.push_back(scale * *lw * lfx * rfx, rwindex);

              if (all.audit || all.hash_inv)
              {
                std::stringstream new_feature_buffer;
                new_feature_buffer << right << '^' << right_fs.space_names[rfn].get()->second << '^' << n;

#ifdef _WIN32
                char* new_space = _strdup("lrq");
                char* new_feature = _strdup(new_feature_buffer.str().c_str());
#else
                char* new_space = strdup("lrq");
                char* new_feature = strdup(new_feature_buffer.str().c_str());
#endif
                right_fs.space_names.push_back(audit_strings_ptr(new audit_strings(new_space, new_feature)));
              }
            }
          }
        }
      }
    }

    if (is_learn)
      base.learn(ec);
    else
      base.predict(ec);

    // Restore example
    if (iter == 0)
    {
      first_prediction = ec.pred.scalar;
      first_loss = ec.loss;
      first_uncertainty = ec.confidence;
    }
    else
    {
      ec.pred.scalar = first_prediction;
      ec.loss = first_loss;
      ec.confidence = first_uncertainty;
    }

    for (string const& i : lrq.lrpairs)
    {
      unsigned char right = i[(which + 1) % 2];
      ec.feature_space[right].truncate_to(lrq.orig_size[right]);
    }
  }
}